

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int read_private_key_from_file
              (void **key_ctx,pem_read_bio_func read_private_key,char *filename,uchar *passphrase)

{
  BIO *bp;
  EVP_PKEY *pEVar1;
  int iVar2;
  
  *key_ctx = (void *)0x0;
  bp = BIO_new_file((char *)read_private_key,"r");
  if (bp == (BIO *)0x0) {
    iVar2 = -1;
  }
  else {
    pEVar1 = PEM_read_bio_PrivateKey(bp,(EVP_PKEY **)0x0,passphrase_cb,filename);
    *key_ctx = pEVar1;
    BIO_free(bp);
    iVar2 = -(uint)(*key_ctx == (void *)0x0);
  }
  return iVar2;
}

Assistant:

static int
read_private_key_from_file(void **key_ctx,
                           pem_read_bio_func read_private_key,
                           const char *filename,
                           const unsigned char *passphrase)
{
    BIO * bp;

    *key_ctx = NULL;

    bp = BIO_new_file(filename, "r");
    if(!bp) {
        return -1;
    }

    *key_ctx = read_private_key(bp, NULL, (pem_password_cb *) passphrase_cb,
                                (void *) LIBSSH2_UNCONST(passphrase));

    BIO_free(bp);
    return (*key_ctx) ? 0 : -1;
}